

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O3

bool __thiscall
fast_float::large_add_from<(unsigned_short)62>
          (fast_float *this,stackvec<(unsigned_short)62> *x,limb_span y,size_t start)

{
  fast_float *pfVar1;
  ushort uVar2;
  ulong uVar3;
  bool bVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  size_t index;
  ulong uVar12;
  
  uVar12 = y.length;
  puVar5 = y.ptr;
  uVar2 = *(ushort *)(this + 0x1f0);
  uVar10 = (ulong)uVar2;
  uVar11 = uVar10;
  if ((unsigned_long *)(uVar10 - uVar12) < puVar5 || uVar10 < uVar12) {
    uVar11 = uVar12 + (long)puVar5;
    if (0x3e < uVar11) {
      return false;
    }
    if (uVar10 < uVar11) {
      memset(this + (ulong)uVar2 * 8,0,uVar11 * 8 + (ulong)uVar2 * -8);
    }
    *(short *)(this + 0x1f0) = (short)uVar11;
  }
  if (puVar5 != (unsigned_long *)0x0) {
    puVar6 = (unsigned_long *)0x0;
    bVar4 = false;
    do {
      uVar10 = *(ulong *)(this + (long)puVar6 * 8 + uVar12 * 8);
      uVar3 = x->data[(long)puVar6];
      lVar7 = uVar10 + x->data[(long)puVar6];
      lVar8 = lVar7 + 1;
      lVar9 = lVar8;
      if (!bVar4) {
        lVar9 = lVar7;
      }
      *(long *)(this + (long)puVar6 * 8 + uVar12 * 8) = lVar9;
      bVar4 = (bool)(lVar8 == 0 & bVar4 | CARRY8(uVar10,uVar3));
      puVar6 = (unsigned_long *)((long)puVar6 + 1);
    } while (puVar5 != puVar6);
    if (bVar4) {
      uVar12 = uVar12 + (long)puVar5;
      do {
        if ((uVar11 & 0xffff) <= uVar12) {
          if (0x3d < (ushort)uVar11) {
            return false;
          }
          *(undefined8 *)(this + (uVar11 & 0xffff) * 8) = 1;
          *(ushort *)(this + 0x1f0) = (ushort)uVar11 + 1;
          return true;
        }
        pfVar1 = this + uVar12 * 8;
        *(long *)pfVar1 = *(long *)pfVar1 + 1;
        uVar12 = uVar12 + 1;
      } while (*(long *)pfVar1 == 0);
    }
  }
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool large_add_from(stackvec<size>& x, limb_span y, size_t start) noexcept {
  // the effective x buffer is from `xstart..x.len()`, so exit early
  // if we can't get that current range.
  if (x.len() < start || y.len() > x.len() - start) {
      FASTFLOAT_TRY(x.try_resize(y.len() + start, 0));
  }

  bool carry = false;
  for (size_t index = 0; index < y.len(); index++) {
    limb xi = x[index + start];
    limb yi = y[index];
    bool c1 = false;
    bool c2 = false;
    xi = scalar_add(xi, yi, c1);
    if (carry) {
      xi = scalar_add(xi, 1, c2);
    }
    x[index + start] = xi;
    carry = c1 | c2;
  }

  // handle overflow
  if (carry) {
    FASTFLOAT_TRY(small_add_from(x, 1, y.len() + start));
  }
  return true;
}